

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O0

_Bool recorded_iter_next(hdr_iter *iter)

{
  _Bool _Var1;
  hdr_iter *iter_local;
  
  do {
    _Var1 = basic_iter_next(iter);
    if (!_Var1) {
      return false;
    }
  } while (iter->count == 0);
  update_iterated_values(iter,iter->value);
  (iter->specifics).recorded.count_added_in_this_iteration_step = iter->count;
  return true;
}

Assistant:

static bool recorded_iter_next(struct hdr_iter* iter)
{
    while (basic_iter_next(iter))
    {
        if (iter->count != 0)
        {
            update_iterated_values(iter, iter->value);

            iter->specifics.recorded.count_added_in_this_iteration_step = iter->count;
            return true;
        }
    }

    return false;
}